

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInfo.Common.cpp
# Opt level: O3

bool PlatformAgnostic::SystemInfo::GetBinaryLocation(char16 *path,uint size)

{
  short sVar1;
  LPCUTF8 __buf;
  ssize_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  LPCUTF8 local_38;
  char *tmp;
  
  __buf = (LPCUTF8)malloc((long)(int)(size * 3));
  local_38 = __buf;
  sVar2 = readlink("/proc/self/exe",(char *)__buf,(ulong)(size * 3 - 1));
  if ((int)(uint)sVar2 < 1) {
    free(__buf);
LAB_00154e2f:
    bVar8 = false;
  }
  else {
    __buf[(uint)sVar2 & 0x7fffffff] = '\0';
    sVar3 = strlen((char *)__buf);
    sVar4 = utf8::DecodeUnitsIntoAndNullTerminate
                      (path,&local_38,__buf + sVar3,doDefault,(bool *)0x0);
    free(local_38);
    bVar8 = true;
    if (sVar4 == 0) {
      if (size != 0 && path != (char16 *)0x0) {
        uVar5 = (ulong)size;
        uVar7 = 1;
        lVar6 = 0;
        do {
          sVar1 = *(short *)((long)L"GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed."
                            + lVar6);
          *(short *)((long)path + lVar6) = sVar1;
          if (sVar1 == 0) {
            if (uVar7 < uVar5) {
              memset((void *)((long)path + lVar6 + 2),0xfd,(uVar5 * 2 - lVar6) - 2);
            }
            goto LAB_00154e2f;
          }
          lVar6 = lVar6 + 2;
          uVar7 = uVar7 + 1;
        } while (uVar5 * 2 != lVar6);
        *path = L'\0';
        if (1 < size) {
          memset(path + 1,0xfd,uVar5 * 2 - 2);
        }
      }
      bVar8 = false;
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
  }
  return bVar8;
}

Assistant:

bool SystemInfo::GetBinaryLocation(char16 *path, const unsigned size)
    {
        int tmp_size = size * 3;
        char *tmp = (char*)malloc(tmp_size);
        if (!GetBinaryLocation(tmp, tmp_size))
        {
            free(tmp);
            return false;
        }
        if (utf8::DecodeUnitsIntoAndNullTerminate(path, (LPCUTF8&)tmp, (LPCUTF8)tmp + strlen(tmp)) <= 0)
        {
            free(tmp);
            wcscpy_s(path, size, _u("GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed."));
            return false;
        }
        free(tmp);
        return true;
    }